

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXBinaryTokenizer.cpp
# Opt level: O3

uint8_t Assimp::FBX::anon_unknown_3::ReadByte(char *input,char **cursor,char *end)

{
  uint8_t uVar1;
  uint8_t *puVar2;
  string local_40;
  
  puVar2 = (uint8_t *)*cursor;
  if (puVar2 != (uint8_t *)end) {
    uVar1 = *puVar2;
    *cursor = (char *)(puVar2 + 1);
    return uVar1;
  }
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"cannot ReadByte, out of bounds","");
  TokenizeError(&local_40,(long)*cursor - (long)input);
}

Assistant:

uint8_t ReadByte(const char* input, const char*& cursor, const char* end) {
    if(Offset(cursor, end) < sizeof( uint8_t ) ) {
        TokenizeError("cannot ReadByte, out of bounds",input, cursor);
    }

    uint8_t word;/* = *reinterpret_cast< const uint8_t* >( cursor )*/
    ::memcpy( &word, cursor, sizeof( uint8_t ) );
    ++cursor;

    return word;
}